

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

void __thiscall Assimp::FBX::AnimationCurve::~AnimationCurve(AnimationCurve *this)

{
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurve_00245df0;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->attributes).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->values).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->keys).super__Vector_base<long,_std::allocator<long>_>);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

AnimationCurve::~AnimationCurve()
{
    // empty
}